

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxInReference_EstimateTxInVsize_Test::TestBody
          (ConfidentialTxInReference_EstimateTxInVsize_Test *this)

{
  pointer pcVar1;
  AddressType addr_type;
  Script claim_script;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  char *message;
  long lVar5;
  long lVar6;
  Script *pSVar7;
  long lVar8;
  ConfidentialTxIn *tx_in;
  long lVar9;
  initializer_list<TestEstimateConfidentialTxInRefVector> __l;
  AssertionResult gtest_ar;
  uint32_t vsize;
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  test_vector;
  Script script_template;
  BlindFactor blind_factor;
  BlindFactor entropy;
  ConfidentialValue issuance_amount;
  ConfidentialValue inflation_keys;
  Amount token_amount;
  Amount issue_amount;
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn pegin_txin;
  ConfidentialTxIn txin;
  ConfidentialTxInReference txin_ref;
  ConfidentialTxIn reissue_txin;
  ConfidentialTxIn *pCVar10;
  string in_stack_ffffffffffffdd00;
  string sVar11;
  undefined7 in_stack_ffffffffffffdd01;
  undefined7 uVar12;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffdd08;
  undefined8 in_stack_ffffffffffffdd10;
  undefined8 in_stack_ffffffffffffdd18;
  undefined4 in_stack_ffffffffffffdd20;
  uint uVar13;
  ByteData local_22d8;
  ByteData local_22c0;
  int local_22a4;
  undefined1 local_22a0 [56];
  AssertHelper local_2268;
  BlindFactor local_2260;
  BlindFactor local_2240;
  ConfidentialValue local_2220;
  ConfidentialValue local_21f8;
  Amount local_21d0;
  Amount local_21c0;
  ConfidentialTxIn local_21b0;
  Script local_2050;
  ScriptWitness local_2018;
  ScriptWitness local_1ff8;
  ScriptWitness local_1fd8;
  ScriptWitness local_1fb8;
  ScriptWitness local_1f98;
  ScriptWitness local_1f78;
  ConfidentialTxIn local_1f58;
  ConfidentialTxIn local_1df8;
  undefined1 local_1c98 [352];
  undefined8 local_1b38;
  uint32_t local_1b30;
  Script local_1b28;
  Script local_1af0;
  bool local_1ab8;
  _Alloc_hider local_1ab0;
  char local_1aa0 [16];
  undefined8 local_1a90;
  ConfidentialTxIn local_1a88;
  undefined8 local_1928;
  undefined4 local_1920;
  Script local_1918;
  Script local_18e0;
  undefined1 local_18a8;
  undefined1 *local_18a0 [2];
  undefined1 local_1890 [16];
  undefined8 local_1880;
  ConfidentialTxIn local_1878;
  undefined8 local_1718;
  undefined4 local_1710;
  Script local_1708;
  Script local_16d0;
  undefined1 local_1698;
  undefined1 *local_1690 [2];
  undefined1 local_1680 [16];
  undefined8 local_1670;
  ConfidentialTxIn local_1668;
  undefined8 local_1508;
  undefined4 local_1500;
  Script local_14f8;
  Script local_14c0;
  undefined1 local_1488;
  undefined1 *local_1480 [2];
  undefined1 local_1470 [16];
  undefined8 local_1460;
  ConfidentialTxIn local_1458;
  undefined8 local_12f8;
  undefined4 local_12f0;
  Script local_12e8;
  Script local_12b0;
  undefined1 local_1278;
  undefined1 *local_1270 [2];
  undefined1 local_1260 [16];
  undefined8 local_1250;
  ConfidentialTxIn local_1248;
  undefined8 local_10e8;
  undefined4 local_10e0;
  Script local_10d8;
  Script local_10a0;
  undefined1 local_1068;
  undefined1 *local_1060 [2];
  undefined1 local_1050 [16];
  undefined8 local_1040;
  ConfidentialTxIn local_1038;
  undefined8 local_ed8;
  undefined4 local_ed0;
  Script local_ec8;
  Script local_e90;
  undefined1 local_e58;
  undefined1 *local_e50 [2];
  undefined1 local_e40 [16];
  undefined8 local_e30;
  ConfidentialTxIn local_e28;
  undefined8 local_cc8;
  undefined4 local_cc0;
  Script local_cb8;
  Script local_c80;
  undefined1 local_c48;
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined8 local_c20;
  ConfidentialTxIn local_c18;
  undefined8 local_ab8;
  undefined4 local_ab0;
  Script local_aa8;
  Script local_a70;
  undefined1 local_a38;
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  undefined8 local_a10;
  ConfidentialTxIn local_a08;
  undefined8 local_8a8;
  undefined4 local_8a0;
  Script local_898;
  Script local_860;
  undefined1 local_828;
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined8 local_800;
  ConfidentialTxIn local_7f8;
  undefined8 local_698;
  undefined4 local_690;
  Script local_688;
  Script local_650;
  undefined1 local_618;
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined8 local_5f0;
  ConfidentialTxIn local_5e8;
  undefined8 local_488;
  undefined4 local_480;
  Script local_478;
  Script local_440;
  undefined1 local_408;
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  ConfidentialTxIn local_3d8;
  undefined8 local_278;
  undefined4 local_270;
  Script local_268;
  Script local_230;
  undefined1 local_1f8;
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  Script local_1c8;
  ConfidentialTxIn local_190;
  
  if (TestBody()::multisig_script_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_);
    if (iVar4 != 0) {
      TestBody()::multisig_script_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::multisig_script_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::multisig_script_abi_cxx11_,
                 "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
    }
  }
  cfd::core::Amount::Amount(&local_21c0,10000000);
  cfd::core::Amount::Amount(&local_21d0,10000000);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1df8);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1f58);
  pcVar1 = local_1c98 + 0x10;
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c98,"00e1f50500000000","");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1f78,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_1f78._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_1f78.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,"c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1f98,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_1f98._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_1f98.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,"06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1fb8,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_1fb8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_1fb8.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a","");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1fd8,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_1fd8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_1fd8.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_1ff8,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_1ff8._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_1ff8.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_21b0,(string *)local_1c98);
  cfd::core::ConfidentialTxIn::AddPeginWitnessStack(&local_2018,&local_1f58,(ByteData *)&local_21b0)
  ;
  local_2018._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007da970;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_2018.witness_stack_);
  if (local_21b0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_21b0.super_AbstractTxIn._vptr_AbstractTxIn,
                    (long)local_21b0.super_AbstractTxIn.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_21b0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_21b0);
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_190);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_2220,&local_21c0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_21f8,&local_21d0);
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"
             ,"");
  cfd::core::BlindFactor::BlindFactor(&local_2240,(string *)local_1c98);
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  local_1c98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c98,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf"
             ,"");
  cfd::core::BlindFactor::BlindFactor(&local_2260,(string *)local_1c98);
  if ((pointer)local_1c98._0_8_ != pcVar1) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ + 1);
  }
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_1c98);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_22a0);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xffffffffffffdd00);
  cfd::core::ByteData::ByteData(&local_22d8);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&local_21b0,(ByteData256 *)local_1c98,(ByteData256 *)local_22a0,&local_2220,&local_21f8
             ,(ByteData *)&stack0xffffffffffffdd00,&local_22d8);
  if ((ConfidentialTxIn *)
      local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (ConfidentialTxIn *)0x0) {
    operator_delete(local_22d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_22d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_22d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT71(in_stack_ffffffffffffdd01,in_stack_ffffffffffffdd00);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,in_stack_ffffffffffffdd10 - (long)pvVar2);
  }
  if ((pointer)local_22a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_22a0._0_8_,local_22a0._16_8_ - local_22a0._0_8_);
  }
  if ((pointer)local_1c98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c98._0_8_,local_1c98._16_8_ - local_1c98._0_8_);
  }
  cfd::core::BlindFactor::GetData((ByteData256 *)local_22a0,&local_2240);
  cfd::core::BlindFactor::GetData((ByteData256 *)&stack0xffffffffffffdd00,&local_2260);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_1c98);
  cfd::core::ByteData::ByteData(&local_22d8);
  cfd::core::ByteData::ByteData(&local_22c0);
  cfd::core::ConfidentialTxIn::SetIssuance
            (&local_190,(ByteData256 *)local_22a0,(ByteData256 *)&stack0xffffffffffffdd00,
             &local_2220,(ConfidentialValue *)local_1c98,&local_22d8,&local_22c0);
  if ((long *)local_22c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_22c0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_22c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_22c0.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((ConfidentialTxIn *)
      local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (ConfidentialTxIn *)0x0) {
    operator_delete(local_22d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_22d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_22d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1c98._0_8_ = &PTR__ConfidentialValue_007e7aa0;
  if ((_func_int **)local_1c98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1c98._8_8_,local_1c98._24_8_ - local_1c98._8_8_);
  }
  pvVar2 = (void *)CONCAT71(in_stack_ffffffffffffdd01,in_stack_ffffffffffffdd00);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,in_stack_ffffffffffffdd10 - (long)pvVar2);
  }
  if ((pointer)local_22a0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_22a0._0_8_,local_22a0._16_8_ - local_22a0._0_8_);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)local_1c98,&local_1df8);
  local_1b38._0_4_ = kP2pkhAddress;
  local_1b38._4_4_ = 0x96;
  local_1b30 = 0;
  cfd::core::Script::Script(&local_1b28);
  cfd::core::Script::Script(&local_1af0);
  local_1ab8 = false;
  local_1ab0._M_p = local_1aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ab0,"");
  local_1a90._0_4_ = 0;
  local_1a90._4_4_ = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1a88,&local_1df8);
  local_1928 = 0xcd00000001;
  local_1920 = 0;
  cfd::core::Script::Script(&local_1918,&exp_script);
  cfd::core::Script::Script(&local_18e0);
  local_18a8 = 0;
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18a0,"");
  local_1880 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1878,&local_1df8);
  local_1718 = 0x5c00000006;
  local_1710 = 0;
  cfd::core::Script::Script(&local_1708);
  cfd::core::Script::Script(&local_16d0);
  local_1698 = 0;
  local_1690[0] = local_1680;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1690,"");
  local_1670 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1668,&local_1df8);
  local_1508 = 0x7100000005;
  local_1500 = 0;
  local_22a0._0_8_ = local_22a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22a0,"51","");
  cfd::core::Script::Script(&local_14f8,(string *)local_22a0);
  cfd::core::Script::Script(&local_14c0);
  local_1488 = 0;
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1480,"");
  local_1460 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1458,&local_1df8);
  local_12f8 = 0x4500000004;
  local_12f0 = 0;
  cfd::core::Script::Script(&local_12e8);
  cfd::core::Script::Script(&local_12b0);
  local_1278 = 0;
  local_1270[0] = local_1260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1270,"");
  local_1250 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1248,&local_1df8);
  local_10e8 = 0x5300000003;
  local_10e0 = 0;
  cfd::core::Script::Script(&local_10d8,&exp_script);
  cfd::core::Script::Script(&local_10a0);
  local_1068 = 0;
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1060,"");
  local_1040 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_1038,&local_1df8);
  local_ed8 = 0x6a00000003;
  local_ed0 = 0;
  cfd::core::Script::Script(&local_ec8,&TestBody()::multisig_script_abi_cxx11_);
  cfd::core::Script::Script(&local_e90);
  local_e58 = 0;
  local_e50[0] = local_e40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e50,"");
  local_e30 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_e28,&local_1f58);
  local_cc8 = 0xc000000004;
  local_cc0 = 0;
  cfd::core::Script::Script(&local_cb8);
  sVar11 = SUB81(&stack0xffffffffffffdd10,0);
  uVar12 = (undefined7)((ulong)&stack0xffffffffffffdd10 >> 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffdd00,
             "0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd","");
  cfd::core::Script::Script(&local_c80,(string *)&stack0xffffffffffffdd00);
  local_c48 = 0;
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c40,"");
  local_c20 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_c18,&local_21b0);
  local_ab8 = 0x48c00000004;
  local_ab0 = 0;
  cfd::core::Script::Script(&local_aa8);
  cfd::core::Script::Script(&local_a70);
  local_a38 = 1;
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"");
  local_a10 = 0;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_a08,&local_21b0);
  local_8a8 = 0x66d00000004;
  local_8a0 = 0;
  cfd::core::Script::Script(&local_898);
  cfd::core::Script::Script(&local_860);
  local_828 = 1;
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"");
  local_800 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_7f8,&local_21b0);
  local_698 = 0x8ed00000004;
  local_690 = 0;
  cfd::core::Script::Script(&local_688);
  cfd::core::Script::Script(&local_650);
  local_618 = 1;
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"");
  local_5f0 = 0x3400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_5e8,&local_190);
  local_488 = 0x39a00000004;
  local_480 = 0;
  cfd::core::Script::Script(&local_478);
  cfd::core::Script::Script(&local_440);
  local_408 = 1;
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"");
  local_3e0 = 0x2400000000;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_3d8,&local_190);
  local_278 = 0x4da00000004;
  local_270 = 0;
  cfd::core::Script::Script(&local_268);
  cfd::core::Script::Script(&local_230);
  local_1f8 = 1;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
  local_1d0 = 0x3400000000;
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_1c98;
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::vector((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
            *)&local_22d8,__l,(allocator_type *)&local_22c0);
  lVar8 = 0x1a30;
  lVar9 = 0x1a68;
  lVar5 = 0x1ab8;
  lVar6 = 0x18c0;
  do {
    if ((long *)(local_1c98 + lVar5) != *(long **)(local_1c98 + lVar5 + -0x10)) {
      operator_delete(*(long **)(local_1c98 + lVar5 + -0x10),*(long *)(local_1c98 + lVar5) + 1);
    }
    cfd::core::Script::~Script((Script *)(local_1c98 + lVar9));
    cfd::core::Script::~Script((Script *)(local_1c98 + lVar8));
    cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)(local_1c98 + lVar6));
    lVar8 = lVar8 + -0x210;
    lVar9 = lVar9 + -0x210;
    lVar5 = lVar5 + -0x210;
    lVar6 = lVar6 + -0x210;
  } while (lVar6 != -0x210);
  if ((undefined1 *)CONCAT71(uVar12,sVar11) != &stack0xffffffffffffdd10) {
    operator_delete((undefined1 *)CONCAT71(uVar12,sVar11),(ulong)(in_stack_ffffffffffffdd10 + 1));
  }
  if ((undefined1 *)local_22a0._0_8_ != local_22a0 + 0x10) {
    operator_delete((void *)local_22a0._0_8_,(ulong)(local_22a0._16_8_ + 1));
  }
  if (local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    tx_in = (ConfidentialTxIn *)
            local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
    pCVar10 = (ConfidentialTxIn *)
              local_22d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    do {
      uVar13 = 0;
      cfd::core::Script::Script
                ((Script *)local_22a0,
                 (string *)
                 ((long)&tx_in[1].super_AbstractTxIn.script_witness_.witness_stack_.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data + 0x10));
      pSVar7 = (Script *)
               tx_in[1].blinding_nonce_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pSVar7 != (Script *)0x0) {
        pSVar7 = (Script *)local_22a0;
      }
      cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1c98,tx_in);
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          addr_type = *(AddressType *)&tx_in[1].super_AbstractTxIn._vptr_AbstractTxIn;
          cfd::core::Script::Script(&local_2050,(Script *)&tx_in[1].super_AbstractTxIn.txid_.data_);
          bVar3 = *(bool *)((long)&tx_in[1].super_AbstractTxIn.script_witness_.witness_stack_.
                                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                   ._M_impl.super__Vector_impl_data + 8);
          iVar4 = *(int *)&tx_in[1].asset_entropy_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          local_22a4 = *(int *)((long)&tx_in[1].asset_entropy_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4);
          cfd::core::Script::Script
                    (&local_1c8,
                     (Script *)
                     ((long)&tx_in[1].super_AbstractTxIn.unlocking_script_.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + 0x10));
          claim_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pSVar7;
          claim_script._vptr_Script = (_func_int **)&local_1c8;
          claim_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pCVar10;
          claim_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_1_ = sVar11;
          claim_script.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._1_7_ = uVar12;
          claim_script.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffdd08.ptr_;
          claim_script.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffdd10;
          claim_script.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffdd18;
          cfd::core::ConfidentialTxInReference::EstimateTxInVsize
                    ((ConfidentialTxInReference *)local_1c98,addr_type,&local_2050,bVar3,iVar4,
                     local_22a4,claim_script,(Script *)CONCAT44(uVar13,in_stack_ffffffffffffdd20));
          cfd::core::Script::~Script(&local_1c8);
          cfd::core::Script::~Script(&local_2050);
        }
      }
      else {
        testing::Message::Message((Message *)&stack0xffffffffffffdd00);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_22c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x226,
                   "Expected: (vsize = txin_ref.EstimateTxInVsize( test_data.addr_type, test_data.redeem_script, test_data.is_blind, test_data.exponent, test_data.minimum_bits, test_data.claim_script, template_ptr)) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_22c0,(Message *)&stack0xffffffffffffdd00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_22c0);
        if (CONCAT71(uVar12,sVar11) != 0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && ((long *)CONCAT71(uVar12,sVar11) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(uVar12,sVar11) + 8))();
          }
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&stack0xffffffffffffdd00,"vsize","test_data.size",
                 (uint *)&stack0xffffffffffffdd24,
                 (uint *)((long)&tx_in[1].super_AbstractTxIn._vptr_AbstractTxIn + 4));
      if (sVar11 == (string)0x0) {
        testing::Message::Message((Message *)&local_22c0);
        message = "";
        if (in_stack_ffffffffffffdd08.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((in_stack_ffffffffffffdd08.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x227,message);
        testing::internal::AssertHelper::operator=(&local_2268,(Message *)&local_22c0);
        testing::internal::AssertHelper::~AssertHelper(&local_2268);
        if ((long *)local_22c0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((long *)local_22c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_22c0.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffdd08,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1c98);
      cfd::core::Script::~Script((Script *)local_22a0);
      tx_in = (ConfidentialTxIn *)
              &tx_in[1].asset_entropy_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (tx_in != pCVar10);
  }
  std::
  vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
  ::~vector((vector<TestEstimateConfidentialTxInRefVector,_std::allocator<TestEstimateConfidentialTxInRefVector>_>
             *)&local_22d8);
  local_2260._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007e9418;
  if (local_2260.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2260.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2260.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2260.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2240._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007e9418;
  if (local_2240.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2240.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2240.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2240.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_21f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007e7aa0;
  if (local_21f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_21f8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21f8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2220._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007e7aa0;
  if (local_2220.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2220.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2220.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2220.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_190);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_21b0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_1f58);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_1df8);
  return;
}

Assistant:

TEST(ConfidentialTxInReference, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";

  Amount issue_amount(uint32_t{10000000});
  Amount token_amount(uint32_t{10000000});
  ConfidentialTxIn txin;
  ConfidentialTxIn pegin_txin;
  {
    pegin_txin.AddPeginWitnessStack(ByteData("00e1f50500000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "c23bd031406aa9f7ac994f7385cd8d2605adaadf5a473c82557b4586192681d3"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f"));
    pegin_txin.AddPeginWitnessStack(
        ByteData("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"));
    pegin_txin.AddPeginWitnessStack(
        ByteData(
            "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"));
  }
  ConfidentialTxIn issue_txin;
  ConfidentialTxIn reissue_txin;
  ConfidentialValue issuance_amount(issue_amount);
  ConfidentialValue inflation_keys(token_amount);
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  {
    issue_txin.SetIssuance(
        ByteData256(), ByteData256(), issuance_amount,
        inflation_keys, ByteData(), ByteData());
    reissue_txin.SetIssuance(
        entropy.GetData(), blind_factor.GetData(), issuance_amount,
        ConfidentialValue(), ByteData(), ByteData());
  }

  const std::vector<TestEstimateConfidentialTxInRefVector> test_vector = {
    {txin, AddressType::kP2pkhAddress, 150, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shAddress, 205, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wpkhAddress, 92, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2shP2wshAddress, 113, 0, Script("51"), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wpkhAddress, 69, 0, Script(), Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 83, 0, exp_script, Script(), false, "", 0, 0},
    {txin, AddressType::kP2wshAddress, 106, 0, Script(multisig_script), Script(), false, "", 0, 0},
    // pegin
    {pegin_txin, AddressType::kP2wpkhAddress, 192, 0, Script(),
     Script("0020e8d28b573816ddfcf98578d7b28543e273f5a72a112233445566778899aabbccdd"),
     false, "", 0, 0},
    // issue
    {issue_txin, AddressType::kP2wpkhAddress, 1164, 0, Script(), Script(), true, "", 0, 0},
    {issue_txin, AddressType::kP2wpkhAddress, 1645, 0, Script(), Script(), true, "", 0, 36},
    {issue_txin, AddressType::kP2wpkhAddress, 2285, 0, Script(), Script(), true, "", 0, 52},
    // reissue
    {reissue_txin, AddressType::kP2wpkhAddress, 922, 0, Script(),Script(), true, "", 0, 36},
    {reissue_txin, AddressType::kP2wpkhAddress, 1242, 0, Script(), Script(), true, "", 0, 52},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    ConfidentialTxInReference txin_ref(test_data.txin);
    EXPECT_NO_THROW((vsize = txin_ref.EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.is_blind,
        test_data.exponent, test_data.minimum_bits,
        test_data.claim_script, template_ptr)));
    EXPECT_EQ(vsize, test_data.size);
  }
}